

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Index * findIndexOrPrimaryKey(sqlite3 *db,char *zName,char *zDb)

{
  Table *pTab_00;
  Table *pTab;
  Index *pIdx;
  char *zDb_local;
  char *zName_local;
  sqlite3 *db_local;
  
  pTab = (Table *)sqlite3FindIndex(db,zName,zDb);
  if ((((Index *)pTab == (Index *)0x0) &&
      (pTab_00 = sqlite3FindTable(db,zName,zDb), pTab_00 != (Table *)0x0)) &&
     ((pTab_00->tabFlags & 0x20) != 0)) {
    pTab = (Table *)sqlite3PrimaryKeyIndex(pTab_00);
  }
  return (Index *)pTab;
}

Assistant:

static Index *findIndexOrPrimaryKey(
  sqlite3 *db,
  const char *zName,
  const char *zDb
){
  Index *pIdx = sqlite3FindIndex(db, zName, zDb);
  if( pIdx==0 ){
    Table *pTab = sqlite3FindTable(db, zName, zDb);
    if( pTab && !HasRowid(pTab) ) pIdx = sqlite3PrimaryKeyIndex(pTab);
  }
  return pIdx;
}